

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPathAlike.h
# Opt level: O3

void OpenSteer::
     mapPointToPathAlike<OpenSteer::PolylineSegmentedPathwaySegmentRadii,(anonymous_namespace)::PointToSegmentIndexMapping>
               (PolylineSegmentedPathwaySegmentRadii *pathAlike,Vec3 *point,
               PointToSegmentIndexMapping *mapping)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float radius;
  float segmentDistance;
  float local_60;
  float local_5c;
  undefined8 local_58;
  float local_50;
  undefined4 local_4c;
  PointToSegmentIndexMapping *local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  local_48 = mapping;
  iVar1 = (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    local_60 = 3.4028235e+38;
    sVar2 = 0;
    do {
      local_4c = 0;
      local_5c = 0.0;
      local_58 = 0;
      local_50 = 0.0;
      local_40 = 0;
      local_38 = 0;
      (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[0x13])
                (pathAlike,sVar2,point,&local_4c,&local_58,&local_40,&local_5c);
      fVar3 = point->x - (float)local_58;
      fVar4 = point->y - local_58._4_4_;
      fVar5 = point->z - local_50;
      fVar3 = SQRT(fVar5 * fVar5 + fVar3 * fVar3 + fVar4 * fVar4) - local_5c;
      if (fVar3 < local_60) {
        local_48->segmentIndex = sVar2;
        local_60 = fVar3;
      }
      (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[0xb])(pathAlike,sVar2);
      sVar2 = sVar2 + 1;
    } while (CONCAT44(extraout_var,iVar1) != sVar2);
  }
  return;
}

Assistant:

void mapPointToPathAlike( PathAlike const& pathAlike, Vec3 const& point, Mapping& mapping ) {
        PointToPathAlikeMapping< PathAlike, Mapping >::map( pathAlike, point, mapping );
    }